

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_write.cpp
# Opt level: O0

void writevector(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *c,string *filename)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  ostream *this;
  size_type sVar4;
  reference pvVar5;
  int local_22c;
  int i;
  bool firstC;
  ostream local_218 [8];
  ofstream myfile;
  string *filename_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *c_local;
  
  std::ofstream::ofstream(local_218);
  std::ofstream::open(local_218,filename,0x10);
  bVar2 = std::ofstream::is_open();
  if ((bVar2 & 1) == 0) {
    this = std::operator<<((ostream *)&std::cout,"\nfailure to write file");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  bVar1 = true;
  for (local_22c = 0;
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(c), (ulong)(long)local_22c < sVar4; local_22c = local_22c + 1) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](c,(long)local_22c);
    std::operator<<(local_218,(string *)pvVar5);
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](c,(long)local_22c);
    bVar3 = std::operator==(pvVar5,")");
    if ((bVar3) && (bVar1)) {
      std::ostream::operator<<(local_218,std::endl<char,std::char_traits<char>>);
      bVar1 = false;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](c,(long)local_22c);
    bVar3 = std::operator==(pvVar5,";");
    if (bVar3) {
      std::ostream::operator<<(local_218,std::endl<char,std::char_traits<char>>);
    }
  }
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void writevector(vector<string> &c, string filename)
{
	ofstream myfile;
	myfile.open(filename);
	if (!myfile.is_open()) { cout << "\nfailure to write file" << endl; }
	bool firstC = true;
	for (int i = 0; i < c.size(); i++)
	{
		myfile << c[i];
		if (c[i] == ")" && firstC == true)
		{
			myfile << endl;
			firstC = false;
		}
		if (c[i] == ";")
			myfile << endl;

	}

}